

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_sysclktz(int nargs,char **args)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  timezone tz;
  timezone local_18;
  long local_10;
  int local_4;
  
  if (in_EDI == 2) {
    local_10 = in_RSI;
    memset(&local_18,0,8);
    local_18.tz_minuteswest = atoi(*(char **)(local_10 + 8));
    iVar1 = settimeofday((timeval *)0x0,&local_18);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int do_sysclktz(int nargs, char **args)
{
    struct timezone tz;

    if (nargs != 2)
        return -1;

    memset(&tz, 0, sizeof(tz));
    tz.tz_minuteswest = atoi(args[1]);   
    if (settimeofday(NULL, &tz))
        return -1;
    return 0;
}